

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plannerbase.cpp
# Opt level: O0

void __thiscall
despot::PlannerBase::PlannerBase
          (PlannerBase *this,string *lower_bounds_str,string *base_lower_bounds_str,
          string *upper_bounds_str,string *base_upper_bounds_str)

{
  Descriptor *pDVar1;
  string local_c0;
  string local_a0;
  string local_70;
  string local_50;
  string *local_30;
  string *base_upper_bounds_str_local;
  string *upper_bounds_str_local;
  string *base_lower_bounds_str_local;
  string *lower_bounds_str_local;
  PlannerBase *this_local;
  
  this->_vptr_PlannerBase = (_func_int **)&PTR__PlannerBase_0026ee10;
  local_30 = base_upper_bounds_str;
  base_upper_bounds_str_local = upper_bounds_str;
  upper_bounds_str_local = base_lower_bounds_str;
  base_lower_bounds_str_local = lower_bounds_str;
  lower_bounds_str_local = (string *)this;
  std::__cxx11::string::string((string *)&local_50,(string *)lower_bounds_str);
  std::__cxx11::string::string((string *)&local_70,(string *)base_lower_bounds_str);
  std::__cxx11::string::string((string *)&local_a0,(string *)upper_bounds_str);
  std::__cxx11::string::string((string *)&local_c0,(string *)base_upper_bounds_str);
  pDVar1 = BuildUsage(&local_50,&local_70,&local_a0,&local_c0);
  this->usage = pDVar1;
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_a0);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

PlannerBase::PlannerBase(string lower_bounds_str, string base_lower_bounds_str,
		string upper_bounds_str, string base_upper_bounds_str) {
	usage = BuildUsage(lower_bounds_str, base_lower_bounds_str,
			upper_bounds_str, base_upper_bounds_str);
}